

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_base.cpp
# Opt level: O3

void __thiscall zmq::socket_base_t::~socket_base_t(socket_base_t *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  signaler_t *this_00;
  pointer pcVar2;
  pointer pppVar3;
  scoped_lock_t lock;
  scoped_lock_t sStack_28;
  
  (this->super_own_t).super_object_t._vptr_object_t = (_func_int **)&PTR__socket_base_t_00262898;
  (this->super_array_item_t<0>)._vptr_array_item_t = (_func_int **)&DAT_00262a08;
  (this->super_i_poll_events)._vptr_i_poll_events = (_func_int **)&PTR__socket_base_t_00262a28;
  (this->super_i_pipe_events)._vptr_i_pipe_events = (_func_int **)&PTR__socket_base_t_00262a60;
  if (this->_mailbox != (i_mailbox *)0x0) {
    (*this->_mailbox->_vptr_i_mailbox[1])();
    this->_mailbox = (i_mailbox *)0x0;
  }
  this_00 = this->_reaper_signaler;
  if (this_00 != (signaler_t *)0x0) {
    signaler_t::~signaler_t(this_00);
    operator_delete(this_00,0xc);
    this->_reaper_signaler = (signaler_t *)0x0;
  }
  scoped_lock_t::scoped_lock_t(&sStack_28,&this->_monitor_sync);
  stop_monitor(this,true);
  if (this->_destroyed == false) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","_destroyed",
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/socket_base.cpp"
            ,0x12f);
    fflush(_stderr);
    zmq_abort("_destroyed");
  }
  scoped_lock_t::~scoped_lock_t(&sStack_28);
  mutex_t::~mutex_t(&this->_monitor_sync);
  pcVar2 = (this->_last_endpoint)._M_dataplus._M_p;
  paVar1 = &(this->_last_endpoint).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pppVar3 = (this->_pipes)._items.super__Vector_base<zmq::pipe_t_*,_std::allocator<zmq::pipe_t_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (pppVar3 != (pointer)0x0) {
    operator_delete(pppVar3,(long)(this->_pipes)._items.
                                  super__Vector_base<zmq::pipe_t_*,_std::allocator<zmq::pipe_t_*>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pppVar3)
    ;
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_zmq::pipe_t_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_zmq::pipe_t_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_zmq::pipe_t_*>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_zmq::pipe_t_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_zmq::pipe_t_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_zmq::pipe_t_*>_>_>
               *)&this->_inprocs);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<zmq::own_t_*,_zmq::pipe_t_*>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<zmq::own_t_*,_zmq::pipe_t_*>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<zmq::own_t_*,_zmq::pipe_t_*>_>_>_>
  ::~_Rb_tree(&(this->_endpoints)._M_t);
  mutex_t::~mutex_t(&this->_sync);
  own_t::~own_t(&this->super_own_t);
  return;
}

Assistant:

zmq::socket_base_t::~socket_base_t ()
{
    if (_mailbox)
        LIBZMQ_DELETE (_mailbox);

    if (_reaper_signaler)
        LIBZMQ_DELETE (_reaper_signaler);

    scoped_lock_t lock (_monitor_sync);
    stop_monitor ();

    zmq_assert (_destroyed);
}